

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O2

int xstcMetadata(char *metadata,char *base)

{
  FILE *pFVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  xmlNodePtr pxVar7;
  long lVar8;
  long lVar9;
  xmlChar *pxVar10;
  char *pcVar11;
  undefined8 uVar12;
  char *pcVar13;
  xmlNodePtr cur;
  int *piVar14;
  xmlChar *pxVar15;
  xmlChar *pxVar16;
  long lVar17;
  char *msg;
  xmlChar *local_70;
  
  lVar6 = xmlReadFile(metadata,0,2);
  if (lVar6 == 0) {
    pcVar11 = "Failed to parse %s\n";
  }
  else {
    pxVar7 = (xmlNodePtr)xmlDocGetRootElement(lVar6);
    if ((pxVar7 != (xmlNodePtr)0x0) && (iVar2 = xmlStrEqual(pxVar7->name,"testSet"), iVar2 != 0)) {
      lVar8 = xmlGetProp(pxVar7,"contributor");
      if (lVar8 == 0) {
        lVar8 = xmlStrdup("Unknown");
      }
      lVar9 = xmlGetProp(pxVar7,"name");
      if (lVar9 == 0) {
        lVar9 = xmlStrdup("Unknown");
      }
      printf("## %s test suite for Schemas version %s\n",lVar8,lVar9);
      (*_xmlFree)(lVar8);
      (*_xmlFree)(lVar9);
      pxVar7 = getNext(pxVar7,"./ts:testGroup[1]");
      if ((pxVar7 == (xmlNodePtr)0x0) || (iVar2 = xmlStrEqual(pxVar7->name,"testGroup"), iVar2 == 0)
         ) {
        fprintf(_stderr,"Unexpected format %s\n",metadata);
      }
      else {
        for (; pxVar7 != (xmlNodePtr)0x0;
            pxVar7 = getNext(pxVar7,"following-sibling::ts:testGroup[1]")) {
          xmlResetLastError();
          testErrorsSize = 0;
          testErrors[0] = '\0';
          iVar2 = xmlMemUsed();
          pxVar10 = getString(pxVar7,"string(ts:schemaTest/ts:schemaDocument/@xlink:href)");
          if ((pxVar10 == (xmlChar *)0x0) || (*pxVar10 == '\0')) {
            uVar12 = xmlGetLineNo(pxVar7);
            test_log("testGroup line %ld misses href for schemaDocument\n",uVar12);
            pcVar11 = (char *)0x0;
            local_70 = (xmlChar *)0x0;
            lVar8 = 0;
LAB_00102fd9:
            if (pxVar10 != (xmlChar *)0x0) goto LAB_0010304a;
          }
          else {
            pcVar11 = (char *)xmlBuildURI(pxVar10,base);
            if (pcVar11 == (char *)0x0) {
              uVar12 = xmlGetLineNo(pxVar7);
              test_log("Failed to build path to schemas testGroup line %ld : %s\n",uVar12,pxVar10);
              lVar8 = 0;
              local_70 = (xmlChar *)0x0;
              pcVar11 = (char *)0x0;
            }
            else {
              iVar3 = checkTestFile(pcVar11);
              if (iVar3 == 0) {
                uVar12 = xmlGetLineNo();
                test_log("schemas for testGroup line %ld is missing: %s\n",uVar12,pcVar11);
              }
              else {
                local_70 = getString(pxVar7,"string(ts:schemaTest/ts:expected/@validity)");
                if (local_70 != (xmlChar *)0x0) {
                  nb_tests = nb_tests + 1;
                  iVar3 = xmlStrEqual(local_70,"valid");
                  if (iVar3 == 0) {
                    iVar3 = xmlStrEqual(local_70,"invalid");
                    if (iVar3 == 0) {
                      uVar12 = xmlGetLineNo(pxVar7);
                      test_log("testGroup line %ld misses unexpected validity value%s\n",uVar12,
                               local_70);
                    }
                    else {
                      nb_schematas = nb_schematas + 1;
                      uVar12 = xmlSchemaNewParserCtxt(pcVar11);
                      xmlSchemaSetParserErrors(uVar12,testErrorHandler,testErrorHandler,uVar12);
                      lVar8 = xmlSchemaParse(uVar12);
                      xmlSchemaFreeParserCtxt(uVar12);
                      if (lVar8 != 0) {
                        test_log("Failed to detect error in schemas %s\n",pcVar11);
                        nb_errors = nb_errors + 1;
                        goto LAB_0010304a;
                      }
                      pcVar13 = strstr(testErrors,"nimplemented");
                      if (pcVar13 != (char *)0x0) {
                        nb_unimplemented = nb_unimplemented + 1;
                        test_log("invalid schemas %s hit an unimplemented block\n",pcVar11);
                        nb_errors = nb_errors + 1;
                      }
                    }
                    lVar8 = 0;
                    goto LAB_0010304a;
                  }
                  nb_schematas = nb_schematas + 1;
                  uVar12 = xmlSchemaNewParserCtxt(pcVar11);
                  xmlSchemaSetParserErrors(uVar12,testErrorHandler,testErrorHandler,uVar12);
                  lVar8 = xmlSchemaParse(uVar12);
                  xmlSchemaFreeParserCtxt(uVar12);
                  if (lVar8 == 0) {
                    test_log("valid schemas %s failed to parse\n",pcVar11);
LAB_00103164:
                    nb_errors = nb_errors + 1;
                  }
                  else {
                    pcVar13 = strstr(testErrors,"nimplemented");
                    if (pcVar13 != (char *)0x0) {
                      test_log("valid schemas %s hit an unimplemented block\n",pcVar11);
                      nb_unimplemented = nb_unimplemented + 1;
                      goto LAB_00103164;
                    }
                  }
                  for (cur = getNext(pxVar7,"./ts:instanceTest[1]"); cur != (xmlNodePtr)0x0;
                      cur = getNext(cur,"following-sibling::ts:instanceTest[1]")) {
                    piVar14 = &nb_errors;
                    if (lVar8 == 0) {
LAB_00103432:
                      *piVar14 = *piVar14 + 1;
                    }
                    else {
                      xmlResetLastError();
                      testErrorsSize = 0;
                      testErrors[0] = '\0';
                      iVar3 = xmlMemUsed();
                      pxVar15 = getString(cur,"string(ts:instanceDocument/@xlink:href)");
                      if (pxVar15 == (xmlChar *)0x0) {
                        uVar12 = xmlGetLineNo(cur);
                        test_log("testGroup line %ld misses href for schemaDocument\n",uVar12);
                      }
                      else {
                        if (*pxVar15 == '\0') {
                          uVar12 = xmlGetLineNo(cur);
                          test_log("testGroup line %ld misses href for schemaDocument\n",uVar12);
LAB_001032f8:
                          lVar9 = 0;
                          lVar17 = 0;
                          pxVar16 = (xmlChar *)0x0;
                          pcVar13 = (char *)0x0;
                        }
                        else {
                          pcVar13 = (char *)xmlBuildURI(pxVar15,base);
                          pFVar1 = _stderr;
                          if (pcVar13 == (char *)0x0) {
                            uVar12 = xmlGetLineNo(cur);
                            fprintf(pFVar1,
                                    "Failed to build path to schemas testGroup line %ld : %s\n",
                                    uVar12,pxVar15);
                            goto LAB_001032f8;
                          }
                          iVar4 = checkTestFile(pcVar13);
                          if (iVar4 == 0) {
                            uVar12 = xmlGetLineNo();
                            test_log("schemas for testGroup line %ld is missing: %s\n",uVar12,
                                     pcVar13);
LAB_00103321:
                            lVar9 = 0;
                            lVar17 = 0;
                            pxVar16 = (xmlChar *)0x0;
                          }
                          else {
                            pxVar16 = getString(cur,"string(ts:expected/@validity)");
                            pFVar1 = _stderr;
                            if (pxVar16 == (xmlChar *)0x0) {
                              uVar12 = xmlGetLineNo(cur);
                              fprintf(pFVar1,"instanceDocument line %ld misses expected validity\n",
                                      uVar12);
                              goto LAB_00103321;
                            }
                            nb_tests = nb_tests + 1;
                            lVar9 = xmlReadFile(pcVar13,0,2);
                            if (lVar9 == 0) {
                              fprintf(_stderr,"instance %s fails to parse\n",pcVar13);
                              nb_errors = nb_errors + 1;
                              lVar9 = 0;
                              lVar17 = 0;
                            }
                            else {
                              lVar17 = xmlSchemaNewValidCtxt(lVar8);
                              xmlSchemaSetValidErrors
                                        (lVar17,testErrorHandler,testErrorHandler,lVar17);
                              iVar4 = xmlSchemaValidateDoc(lVar17,lVar9);
                              iVar5 = xmlStrEqual(pxVar16,"valid");
                              if (iVar5 == 0) {
                                iVar5 = xmlStrEqual(pxVar16,"invalid");
                                if (iVar5 == 0) {
                                  uVar12 = xmlGetLineNo(cur);
                                  test_log("instanceDocument line %ld has unexpected validity value%s\n"
                                           ,uVar12,pxVar16);
                                }
                                else if (iVar4 == 0) {
                                  msg = "Failed to detect invalid instance %s against %s\n";
                                  goto LAB_001032a0;
                                }
                              }
                              else if (iVar4 < 1) {
                                if (iVar4 < 0) {
                                  test_log("valid instance %s got internal error validating %s\n",
                                           pcVar13,pcVar11);
                                  nb_internals = nb_internals + 1;
                                  nb_errors = nb_errors + 1;
                                }
                              }
                              else {
                                msg = "valid instance %s failed to validate against %s\n";
LAB_001032a0:
                                test_log(msg,pcVar13,pcVar11);
                                nb_errors = nb_errors + 1;
                              }
                            }
                          }
                        }
                        (*_xmlFree)(pxVar15);
                        if (pcVar13 != (char *)0x0) {
                          (*_xmlFree)(pcVar13);
                        }
                        if (pxVar16 != (xmlChar *)0x0) {
                          (*_xmlFree)(pxVar16);
                        }
                        if (lVar17 != 0) {
                          xmlSchemaFreeValidCtxt(lVar17);
                        }
                        if (lVar9 != 0) {
                          xmlFreeDoc(lVar9);
                        }
                      }
                      xmlResetLastError();
                      iVar4 = xmlMemUsed();
                      if (iVar3 != iVar4) {
                        uVar12 = xmlGetLineNo(cur);
                        iVar4 = xmlMemUsed();
                        test_log("Validation of tests starting line %ld leaked %d\n",uVar12,
                                 (ulong)(uint)(iVar4 - iVar3));
                        piVar14 = &nb_leaks;
                        goto LAB_00103432;
                      }
                    }
                  }
                  goto LAB_00102fd9;
                }
                uVar12 = xmlGetLineNo(pxVar7);
                test_log("testGroup line %ld misses expected validity\n",uVar12);
              }
              lVar8 = 0;
              local_70 = (xmlChar *)0x0;
            }
LAB_0010304a:
            (*_xmlFree)(pxVar10);
          }
          if (pcVar11 != (char *)0x0) {
            (*_xmlFree)(pcVar11);
          }
          if (local_70 != (xmlChar *)0x0) {
            (*_xmlFree)();
          }
          if (lVar8 != 0) {
            xmlSchemaFree(lVar8);
          }
          xmlResetLastError();
          iVar3 = xmlMemUsed();
          if (iVar2 != iVar3) {
            uVar12 = xmlGetLineNo(pxVar7);
            iVar3 = xmlMemUsed();
            test_log("Processing test line %ld %s leaked %d\n",uVar12,pcVar11,
                     (ulong)(uint)(iVar3 - iVar2));
            nb_leaks = nb_leaks + 1;
          }
        }
      }
      iVar2 = xmlFreeDoc(lVar6);
      return iVar2;
    }
    pcVar11 = "Unexpected format %s\n";
  }
  iVar2 = fprintf(_stderr,pcVar11,metadata);
  return iVar2;
}

Assistant:

static int
xstcMetadata(const char *metadata, const char *base) {
    xmlDocPtr doc;
    xmlNodePtr cur;
    xmlChar *contributor;
    xmlChar *name;
    int ret = 0;

    doc = xmlReadFile(metadata, NULL, XML_PARSE_NOENT);
    if (doc == NULL) {
        fprintf(stderr, "Failed to parse %s\n", metadata);
	return(-1);
    }

    cur = xmlDocGetRootElement(doc);
    if ((cur == NULL) || (!xmlStrEqual(cur->name, BAD_CAST "testSet"))) {
        fprintf(stderr, "Unexpected format %s\n", metadata);
	return(-1);
    }
    contributor = xmlGetProp(cur, BAD_CAST "contributor");
    if (contributor == NULL) {
        contributor = xmlStrdup(BAD_CAST "Unknown");
    }
    name = xmlGetProp(cur, BAD_CAST "name");
    if (name == NULL) {
        name = xmlStrdup(BAD_CAST "Unknown");
    }
    printf("## %s test suite for Schemas version %s\n", contributor, name);
    xmlFree(contributor);
    xmlFree(name);

    cur = getNext(cur, "./ts:testGroup[1]");
    if ((cur == NULL) || (!xmlStrEqual(cur->name, BAD_CAST "testGroup"))) {
        fprintf(stderr, "Unexpected format %s\n", metadata);
	ret = -1;
	goto done;
    }
    while (cur != NULL) {
        xstcTestGroup(cur, base);
	cur = getNext(cur, "following-sibling::ts:testGroup[1]");
    }

done:
    xmlFreeDoc(doc);
    return(ret);
}